

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderManager.cpp
# Opt level: O3

Mesh * __thiscall
Rml::RenderManager::ReleaseResource
          (Mesh *__return_storage_ptr__,RenderManager *this,Geometry *geometry)

{
  code *pcVar1;
  pointer pVVar2;
  pointer piVar3;
  bool bVar4;
  GeometryData *pGVar5;
  Mesh *__old_val;
  StableVectorIndex index;
  GeometryData local_60;
  
  index = (geometry->
          super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ).resource_handle;
  if (index == Invalid ||
      (geometry->
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ).render_manager != this) {
    bVar4 = Assert("RMLUI_ASSERT(geometry.render_manager == this && geometry.resource_handle != geometry.InvalidHandle())"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/RenderManager.cpp"
                   ,0x16c);
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    index = (geometry->
            super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            ).resource_handle;
  }
  pGVar5 = StableVector<Rml::RenderManager::GeometryData>::operator[](&this->geometry_list,index);
  if (pGVar5->handle != 0) {
    (*this->render_interface->_vptr_RenderInterface[4])();
    pGVar5->handle = 0;
  }
  pVVar2 = (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl
       .super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  (__return_storage_ptr__->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar3 = (pGVar5->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pGVar5->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar3;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pGVar5->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pGVar5->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar5->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pGVar5->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar5->mesh).vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  StableVector<Rml::RenderManager::GeometryData>::erase
            (&local_60,&this->geometry_list,
             (geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle);
  if (local_60.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.mesh.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.mesh.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.mesh.vertices.
                    super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.mesh.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.mesh.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh RenderManager::ReleaseResource(const Geometry& geometry)
{
	RMLUI_ASSERT(geometry.render_manager == this && geometry.resource_handle != geometry.InvalidHandle());

	GeometryData& data = geometry_list[geometry.resource_handle];
	if (data.handle)
	{
		render_interface->ReleaseGeometry(data.handle);
		data.handle = {};
	}
	Mesh result = std::exchange(data.mesh, Mesh());
	geometry_list.erase(geometry.resource_handle);
	return result;
}